

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::SetPeginWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          uint32_t witness_index,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  void *pvVar1;
  wally_tx_witness_stack *stack;
  uchar *witness;
  pointer pCVar2;
  CfdException *this_00;
  uchar *witness_len;
  ulong uVar3;
  allocator local_79;
  uint32_t local_78;
  int ret;
  string function_name;
  undefined1 local_50 [32];
  
  local_78 = witness_index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x6f2,"SetPeginWitnessStack");
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  uVar3 = (ulong)tx_in_index;
  if (*(ulong *)((long)pvVar1 + 0x10) <= uVar3) {
LAB_003aaaed:
    SetElementsTxState(this);
    pCVar2 = (this->vin_).
             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ByteData::ByteData((ByteData *)local_50,data);
    ConfidentialTxIn::SetPeginWitnessStack
              ((ScriptWitness *)&function_name,pCVar2 + uVar3,local_78,(ByteData *)local_50);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    ScriptWitness::ScriptWitness(__return_storage_ptr__,(ScriptWitness *)&function_name);
    ScriptWitness::~ScriptWitness((ScriptWitness *)&function_name);
    return __return_storage_ptr__;
  }
  ret = -2;
  ::std::__cxx11::string::string
            ((string *)&function_name,"wally witness is NULL.",(allocator *)local_50);
  stack = *(wally_tx_witness_stack **)(*(long *)((long)pvVar1 + 8) + 200 + uVar3 * 0xd0);
  if (stack != (wally_tx_witness_stack *)0x0) {
    ::std::__cxx11::string::assign((char *)&function_name);
    witness = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    witness_len = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -(long)witness;
    if (witness_len == (uchar *)0x0) {
      witness_len = (uchar *)0x0;
      witness = (uchar *)0x0;
    }
    ret = wally_tx_witness_stack_set(stack,(ulong)local_78,witness,(size_t)witness_len);
    if (ret == 0) {
      ::std::__cxx11::string::~string((string *)&function_name);
      goto LAB_003aaaed;
    }
  }
  local_50._0_8_ = "cfdcore_elements_transaction.cpp";
  local_50._8_4_ = 0x70a;
  local_50._16_8_ = "SetPeginWitnessStack";
  logger::warn<std::__cxx11::string&,int&>
            ((CfdSourceLocation *)local_50,"{} NG[{}].",&function_name,&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_50,"witness stack set error.",&local_79);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

const ScriptWitness ConfidentialTransaction::SetPeginWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index,
    const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_EINVAL;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally witness is NULL.";
    if (tx_pointer->inputs[tx_in_index].pegin_witness != NULL) {
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;

      // append witness stack
      function_name = "wally_tx_witness_stack_set";
      if (data.empty()) {
        ret =
            wally_tx_witness_stack_set(stack_pointer, witness_index, NULL, 0);
      } else {
        ret = wally_tx_witness_stack_set(
            stack_pointer, witness_index, data.data(), data.size());
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack set error.");
    }
  }
  SetElementsTxState();

  const ScriptWitness &witness =
      vin_[tx_in_index].SetPeginWitnessStack(witness_index, ByteData(data));
  return witness;
}